

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

bool __thiscall
flatbuffers::python::PythonGenerator::generateStructs
          (PythonGenerator *this,string *one_file_code,ImportMap *one_file_imports)

{
  IdlNamer *pIVar1;
  pointer ppSVar2;
  StructDef *struct_def;
  bool bVar3;
  Parser *pPVar4;
  _Rb_tree_node_base *p_Var5;
  pointer ppSVar6;
  _Rb_tree_header *p_Var7;
  string declcode;
  ImportMap imports;
  string local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  import_str;
  
  pPVar4 = (this->super_BaseGenerator).parser_;
  ppSVar6 = (pPVar4->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pIVar1 = &this->namer_;
  do {
    p_Var7 = &imports._M_t._M_impl.super__Rb_tree_header;
    ppSVar2 = (pPVar4->structs_).vec.
              super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar6 == ppSVar2) {
LAB_001ddbbf:
      return ppSVar6 == ppSVar2;
    }
    struct_def = *ppSVar6;
    declcode._M_dataplus._M_p = (pointer)&declcode.field_2;
    declcode._M_string_length = 0;
    declcode.field_2._M_local_buf[0] = '\0';
    imports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    imports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    imports._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    imports._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
    imports._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
    GenStruct(this,struct_def,&declcode,&imports);
    pPVar4 = (this->super_BaseGenerator).parser_;
    if ((pPVar4->opts).generate_object_based_api == true) {
      GenStructForObjectAPI(this,struct_def,&declcode);
      pPVar4 = (this->super_BaseGenerator).parser_;
    }
    if ((pPVar4->opts).one_file == true) {
      p_Var5 = imports._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (declcode._M_string_length != 0) {
        std::operator+(&import_str.first,&declcode,"\n\n");
        std::__cxx11::string::append((string *)one_file_code);
        std::__cxx11::string::~string((string *)&import_str);
        p_Var5 = imports._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      for (; (_Rb_tree_header *)p_Var5 != p_Var7;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair(&import_str,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(p_Var5 + 1));
        std::
        _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>const&>
                  ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)one_file_imports,&import_str);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&import_str);
      }
    }
    else {
      (*(pIVar1->super_Namer)._vptr_Namer[0xc])(&import_str,pIVar1,struct_def,3);
      (*(pIVar1->super_Namer)._vptr_Namer[0xc])(&local_90,pIVar1,struct_def,1);
      bVar3 = SaveType(this,&local_90,(struct_def->super_Definition).defined_namespace,&declcode,
                       &imports,&import_str.first,true);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&import_str);
      if (!bVar3) {
        std::
        _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&imports._M_t);
        std::__cxx11::string::~string((string *)&declcode);
        goto LAB_001ddbbf;
      }
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&imports._M_t);
    std::__cxx11::string::~string((string *)&declcode);
    ppSVar6 = ppSVar6 + 1;
    pPVar4 = (this->super_BaseGenerator).parser_;
  } while( true );
}

Assistant:

bool generateStructs(std::string *one_file_code,
                       ImportMap &one_file_imports) const {
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      auto &struct_def = **it;
      std::string declcode;
      ImportMap imports;
      GenStruct(struct_def, &declcode, imports);
      if (parser_.opts.generate_object_based_api) {
        GenStructForObjectAPI(struct_def, &declcode);
      }

      if (parser_.opts.one_file) {
        if (!declcode.empty()) { *one_file_code += declcode + "\n\n"; }

        for (auto import_str : imports) { one_file_imports.insert(import_str); }
      } else {
        const std::string mod =
            namer_.File(struct_def, SkipFile::SuffixAndExtension);
        if (!SaveType(namer_.File(struct_def, SkipFile::Suffix),
                      *struct_def.defined_namespace, declcode, imports, mod,
                      true))
          return false;
      }
    }
    return true;
  }